

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void CTcSymLocal::s_gen_code_setlcl_stk(int var_num,int is_param)

{
  undefined8 in_RAX;
  size_t in_RCX;
  void *__buf;
  uint16_t tmp;
  int __fd;
  char buf [2];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (var_num < 0x100) {
    CTcGenTarg::write_op(G_cg,(is_param != 0) * '\x02' + 0xe0);
    __fd = (int)&uStack_18 + 5;
    uStack_18._0_6_ = CONCAT15((char)var_num,(undefined5)uStack_18);
    __buf = (void *)0x1;
  }
  else {
    CTcGenTarg::write_op(G_cg,(is_param != 0) * '\x02' + 0xe1);
    __fd = (int)&uStack_18 + 6;
    uStack_18 = CONCAT26((short)var_num,(undefined6)uStack_18);
    __buf = (void *)0x2;
  }
  CTcDataStream::write(&G_cs->super_CTcDataStream,__fd,__buf,in_RCX);
  G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  return;
}

Assistant:

void CTcSymLocal::s_gen_code_setlcl_stk(int var_num, int is_param)
{
    /* use the shortest form that will fit our variable index */
    if (var_num <= 255)
    {
        /* use the one-byte instruction */
        G_cg->write_op(is_param ? OPC_SETARG1 : OPC_SETLCL1);
        G_cs->write((char)var_num);
    }
    else
    {
        /* big number - use the two-byte instruction */
        G_cg->write_op(is_param ? OPC_SETARG2 : OPC_SETLCL2);
        G_cs->write2(var_num);
    }

    /* the setarg/setlcl ops remove the rvalue */
    G_cg->note_pop();
}